

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_resend(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_flight_item *pmVar2;
  int iVar3;
  mbedtls_ssl_flight_item *cur;
  
  pmVar1 = ssl->handshake;
  if (pmVar1->retransmit_state != '\x01') {
    pmVar1->cur_msg = pmVar1->flight;
    ssl_swap_epochs(ssl);
    ssl->handshake->retransmit_state = '\x01';
  }
  while( true ) {
    pmVar1 = ssl->handshake;
    pmVar2 = pmVar1->cur_msg;
    if (pmVar2 == (mbedtls_ssl_flight_item *)0x0) break;
    if ((pmVar2->type == '\x16') && (*pmVar2->p == '\x14')) {
      ssl_swap_epochs(ssl);
    }
    memcpy(ssl->out_msg,pmVar2->p,pmVar2->len);
    ssl->out_msglen = pmVar2->len;
    ssl->out_msgtype = (uint)pmVar2->type;
    ssl->handshake->cur_msg = pmVar2->next;
    iVar3 = mbedtls_ssl_write_record(ssl);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  if (ssl->state == 0x10) {
    pmVar1->retransmit_state = '\x03';
    return 0;
  }
  pmVar1->retransmit_state = '\x02';
  if (ssl->f_set_timer == (mbedtls_ssl_set_timer_t *)0x0) {
    return 0;
  }
  (*ssl->f_set_timer)(ssl->p_timer,pmVar1->retransmit_timeout >> 2,pmVar1->retransmit_timeout);
  return 0;
}

Assistant:

int mbedtls_ssl_resend( mbedtls_ssl_context *ssl )
{
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> mbedtls_ssl_resend" ) );

    if( ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "initialise resending" ) );

        ssl->handshake->cur_msg = ssl->handshake->flight;
        ssl_swap_epochs( ssl );

        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_SENDING;
    }

    while( ssl->handshake->cur_msg != NULL )
    {
        int ret;
        mbedtls_ssl_flight_item *cur = ssl->handshake->cur_msg;

        /* Swap epochs before sending Finished: we can't do it after
         * sending ChangeCipherSpec, in case write returns WANT_READ.
         * Must be done before copying, may change out_msg pointer */
        if( cur->type == MBEDTLS_SSL_MSG_HANDSHAKE &&
            cur->p[0] == MBEDTLS_SSL_HS_FINISHED )
        {
            ssl_swap_epochs( ssl );
        }

        memcpy( ssl->out_msg, cur->p, cur->len );
        ssl->out_msglen = cur->len;
        ssl->out_msgtype = cur->type;

        ssl->handshake->cur_msg = cur->next;

        MBEDTLS_SSL_DEBUG_BUF( 3, "resent handshake message header", ssl->out_msg, 12 );

        if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
            return( ret );
        }
    }

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER )
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    else
    {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;
        ssl_set_timer( ssl, ssl->handshake->retransmit_timeout );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= mbedtls_ssl_resend" ) );

    return( 0 );
}